

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ShellCommand.cpp
# Opt level: O1

void __thiscall
llbuild::buildsystem::ShellCommand::executeExternalCommand
          (ShellCommand *this,BuildSystem *system,TaskInterface ti,QueueJobContext *context,
          Optional<std::function<void_(llbuild::basic::ProcessResult)>_> *completionFn)

{
  ShellCommandHandler *pSVar1;
  HandlerState *pHVar2;
  pointer pSVar3;
  pointer pSVar4;
  ProcessAttributes attributes;
  undefined8 uVar5;
  undefined4 uVar6;
  SmallVectorImpl<std::pair<llvm::StringRef,_llvm::StringRef>_> *pSVar7;
  void *pvVar8;
  void *pvVar9;
  undefined8 *puVar10;
  code *pcVar11;
  undefined8 **ppuVar12;
  ArrayRef<llvm::StringRef> commandLine;
  ArrayRef<std::pair<llvm::StringRef,_llvm::StringRef>_> environment;
  anon_class_72_4_ab194bda commandCompletionFn;
  TaskInterface local_130;
  QueueJobContext *local_120;
  undefined8 *local_118;
  char acStack_110 [8];
  code *local_108;
  undefined8 uStack_100;
  undefined1 local_f0;
  undefined1 uStack_ef;
  undefined6 uStack_ee;
  pointer pcStack_e8;
  size_type local_e0;
  undefined1 uStack_d8;
  undefined1 uStack_d7;
  undefined6 uStack_d6;
  ShellCommand *local_d0;
  BuildSystem *pBStack_c8;
  void *local_c0;
  void *pvStack_b8;
  undefined1 local_b0 [32];
  bool local_90;
  undefined1 local_88 [24];
  code *local_70;
  bool local_68;
  undefined8 *local_58;
  undefined8 uStack_50;
  code *local_48;
  code *pcStack_40;
  
  local_130.ctx = ti.ctx;
  local_130.impl = ti.impl;
  local_120 = context;
  local_d0 = this;
  pBStack_c8 = system;
  local_c0 = local_130.impl;
  pvStack_b8 = local_130.ctx;
  llvm::optional_detail::OptionalStorage<std::function<void_(llbuild::basic::ProcessResult)>,_false>
  ::OptionalStorage((OptionalStorage<std::function<void_(llbuild::basic::ProcessResult)>,_false> *)
                    local_b0,&completionFn->Storage);
  pvVar9 = local_130.ctx;
  pvVar8 = local_130.impl;
  pSVar1 = this->handler;
  if (pSVar1 == (ShellCommandHandler *)0x0) {
    pSVar3 = (this->args).super__Vector_base<llvm::StringRef,_std::allocator<llvm::StringRef>_>.
             _M_impl.super__Vector_impl_data._M_start;
    pSVar4 = (this->args).super__Vector_base<llvm::StringRef,_std::allocator<llvm::StringRef>_>.
             _M_impl.super__Vector_impl_data._M_finish;
    pSVar7 = &(this->env).super_SmallVectorImpl<std::pair<llvm::StringRef,_llvm::StringRef>_>;
    uVar5 = (pSVar7->
            super_SmallVectorTemplateBase<std::pair<llvm::StringRef,_llvm::StringRef>,_true>).
            super_SmallVectorTemplateCommon<std::pair<llvm::StringRef,_llvm::StringRef>,_void>.
            super_SmallVectorBase.BeginX;
    uVar6 = (pSVar7->
            super_SmallVectorTemplateBase<std::pair<llvm::StringRef,_llvm::StringRef>,_true>).
            super_SmallVectorTemplateCommon<std::pair<llvm::StringRef,_llvm::StringRef>,_void>.
            super_SmallVectorBase.Size;
    environment.Length._0_4_ = uVar6;
    environment.Data = (pair<llvm::StringRef,_llvm::StringRef> *)uVar5;
    local_f0 = this->canSafelyInterrupt;
    uStack_ef = 0;
    pcStack_e8 = (this->workingDirectory)._M_dataplus._M_p;
    local_e0 = (this->workingDirectory)._M_string_length;
    uStack_d8 = this->inheritEnv;
    uStack_d7 = this->controlEnabled;
    local_108 = (code *)0x0;
    uStack_100 = 0;
    local_118 = (undefined8 *)0x0;
    acStack_110[0] = '\0';
    acStack_110[1] = '\0';
    acStack_110[2] = '\0';
    acStack_110[3] = '\0';
    acStack_110[4] = '\0';
    acStack_110[5] = '\0';
    acStack_110[6] = '\0';
    acStack_110[7] = '\0';
    puVar10 = (undefined8 *)operator_new(0x48);
    *puVar10 = local_d0;
    puVar10[1] = pBStack_c8;
    puVar10[2] = local_c0;
    puVar10[3] = pvStack_b8;
    llvm::optional_detail::
    OptionalStorage<std::function<void_(llbuild::basic::ProcessResult)>,_false>::OptionalStorage
              ((OptionalStorage<std::function<void_(llbuild::basic::ProcessResult)>,_false> *)
               (puVar10 + 4),
               (OptionalStorage<std::function<void_(llbuild::basic::ProcessResult)>,_false> *)
               local_b0);
    local_68 = true;
    local_70 = std::
               _Function_handler<void_(llbuild::basic::ProcessResult),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/BuildSystem/ShellCommand.cpp:356:30)>
               ::_M_invoke;
    local_88[8] = acStack_110[0];
    local_88[9] = acStack_110[1];
    local_88[10] = acStack_110[2];
    local_88[0xb] = acStack_110[3];
    local_88[0xc] = acStack_110[4];
    local_88[0xd] = acStack_110[5];
    local_88[0xe] = acStack_110[6];
    local_88[0xf] = acStack_110[7];
    local_88._16_8_ =
         std::
         _Function_handler<void_(llbuild::basic::ProcessResult),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/BuildSystem/ShellCommand.cpp:356:30)>
         ::_M_manager;
    local_108 = (code *)0x0;
    uStack_100 = 0;
    attributes.connectToConsole = (bool)uStack_ef;
    attributes.canSafelyInterrupt = (bool)local_f0;
    attributes._2_6_ = uStack_ee;
    attributes.controlEnabled = (bool)uStack_d7;
    attributes.inheritEnvironment = (bool)uStack_d8;
    attributes._26_6_ = uStack_d6;
    attributes.workingDir.Data = pcStack_e8;
    attributes.workingDir.Length = local_e0;
    commandLine.Length = (long)pSVar4 - (long)pSVar3 >> 4;
    commandLine.Data = pSVar3;
    environment.Length._4_4_ = 0;
    local_118 = puVar10;
    local_88._0_8_ = puVar10;
    llbuild::core::TaskInterface::spawn
              (&local_130,local_120,commandLine,environment,attributes,
               (Optional<std::function<void_(llbuild::basic::ProcessResult)>_> *)local_88,
               (ProcessDelegate *)0x0);
    if (local_68 == true) {
      if ((code *)local_88._16_8_ != (code *)0x0) {
        (*(code *)local_88._16_8_)(local_88,local_88,3);
      }
      local_68 = false;
    }
    if (local_108 == (code *)0x0) goto LAB_0015d337;
    ppuVar12 = &local_118;
    pcVar11 = local_108;
  }
  else {
    pHVar2 = (this->handlerState)._M_t.
             super___uniq_ptr_impl<llbuild::buildsystem::HandlerState,_std::default_delete<llbuild::buildsystem::HandlerState>_>
             ._M_t.
             super__Tuple_impl<0UL,_llbuild::buildsystem::HandlerState_*,_std::default_delete<llbuild::buildsystem::HandlerState>_>
             .super__Head_base<0UL,_llbuild::buildsystem::HandlerState_*,_false>._M_head_impl;
    local_58 = (undefined8 *)0x0;
    uStack_50 = 0;
    local_48 = (code *)0x0;
    pcStack_40 = (code *)0x0;
    puVar10 = (undefined8 *)operator_new(0x48);
    *puVar10 = local_d0;
    puVar10[1] = pBStack_c8;
    puVar10[2] = local_c0;
    puVar10[3] = pvStack_b8;
    llvm::optional_detail::
    OptionalStorage<std::function<void_(llbuild::basic::ProcessResult)>,_false>::OptionalStorage
              ((OptionalStorage<std::function<void_(llbuild::basic::ProcessResult)>,_false> *)
               (puVar10 + 4),
               (OptionalStorage<std::function<void_(llbuild::basic::ProcessResult)>,_false> *)
               local_b0);
    pcStack_40 = std::
                 _Function_handler<void_(llbuild::basic::ProcessResult),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/BuildSystem/ShellCommand.cpp:356:30)>
                 ::_M_invoke;
    local_48 = std::
               _Function_handler<void_(llbuild::basic::ProcessResult),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/BuildSystem/ShellCommand.cpp:356:30)>
               ::_M_manager;
    local_58 = puVar10;
    (*pSVar1->_vptr_ShellCommandHandler[3])(pSVar1,pHVar2,this,pvVar8,pvVar9,local_120,&local_58);
    if (local_48 == (code *)0x0) goto LAB_0015d337;
    ppuVar12 = &local_58;
    pcVar11 = local_48;
  }
  (*pcVar11)(ppuVar12,ppuVar12,3);
LAB_0015d337:
  if ((local_90 == true) && ((code *)local_b0._16_8_ != (code *)0x0)) {
    (*(code *)local_b0._16_8_)(local_b0,local_b0,3);
  }
  return;
}

Assistant:

void ShellCommand::executeExternalCommand(
    BuildSystem& system,
    TaskInterface ti,
    QueueJobContext* context,
    llvm::Optional<ProcessCompletionFn> completionFn) {
  auto commandCompletionFn = [this, &system, ti, completionFn](ProcessResult result) mutable {
    if (result.status != ProcessStatus::Succeeded) {
      // If the command failed, there is no need to gather dependencies.
      if (completionFn.hasValue())
        completionFn.getValue()(result);
      return;
    }

    // Collect the discovered dependencies, if used.
    if (!depsPaths.empty()) {
      ti.spawn(QueueJob{ this, [this, &system, ti, completionFn, result](QueueJobContext* context) mutable {
            if (!processDiscoveredDependencies(system, ti, context)) {
              // If we were unable to process the dependencies output, report a
              // failure.
              if (completionFn.hasValue())
                completionFn.getValue()(ProcessStatus::Failed);
              return;
            }
            if (completionFn.hasValue())
              completionFn.getValue()(result);
          }}, QueueJobPriority::High);
      return;
    }

    if (completionFn.hasValue())
      completionFn.getValue()(result);
  };
      
  // Delegate to the handler, if present.
  if (handler) {
    // FIXME: We should consider making this interface capable of feeding
    // back the dependencies directly.
    //
    // FIXME: This needs to honor certain properties of the execution queue
    // (like indicating when the work starts and stops, and communicating with
    // the execution queue delegate controlling how output is handled). It could
    // be the case that this should actually be delegating this work to run on
    // the execution queue, and the queue handles the handoff.
    handler->execute(
        handlerState.get(), this, ti, context, commandCompletionFn);
    return;
  }

  bool connectToConsole = false;

  // Execute the command.
  ti.spawn(
      context, args, env,
      {canSafelyInterrupt, connectToConsole, workingDirectory, inheritEnv, controlEnabled},
      /*completionFn=*/{commandCompletionFn});
}